

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

bool __thiscall BaseIndex::Rewind(BaseIndex *this,CBlockIndex *current_tip,CBlockIndex *new_tip)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  CBlockIndex *pCVar4;
  long in_FS_OFFSET;
  uint256 uStack_78;
  int local_58;
  uint256 local_54;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_best_block_index)._M_b._M_p != current_tip) {
    __assert_fail("current_tip == m_best_block_index",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
                  ,0xf9,"bool BaseIndex::Rewind(const CBlockIndex *, const CBlockIndex *)");
  }
  pCVar4 = CBlockIndex::GetAncestor(current_tip,new_tip->nHeight);
  if (pCVar4 != new_tip) {
    __assert_fail("current_tip->GetAncestor(new_tip->nHeight) == new_tip",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
                  ,0xfa,"bool BaseIndex::Rewind(const CBlockIndex *, const CBlockIndex *)");
  }
  CBlockIndex::GetBlockHash(&local_54,current_tip);
  local_34 = current_tip->nHeight;
  CBlockIndex::GetBlockHash(&uStack_78,new_tip);
  local_58 = new_tip->nHeight;
  iVar3 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xe])
                    (this,&local_54,&uStack_78);
  if ((char)iVar3 != '\0') {
    SetBestBlockIndex(this,new_tip);
    bVar1 = Commit(this);
    bVar2 = true;
    if (bVar1) goto LAB_003ce3d0;
    SetBestBlockIndex(this,current_tip);
  }
  bVar2 = false;
LAB_003ce3d0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool BaseIndex::Rewind(const CBlockIndex* current_tip, const CBlockIndex* new_tip)
{
    assert(current_tip == m_best_block_index);
    assert(current_tip->GetAncestor(new_tip->nHeight) == new_tip);

    if (!CustomRewind({current_tip->GetBlockHash(), current_tip->nHeight}, {new_tip->GetBlockHash(), new_tip->nHeight})) {
        return false;
    }

    // In the case of a reorg, ensure persisted block locator is not stale.
    // Pruning has a minimum of 288 blocks-to-keep and getting the index
    // out of sync may be possible but a users fault.
    // In case we reorg beyond the pruned depth, ReadBlockFromDisk would
    // throw and lead to a graceful shutdown
    SetBestBlockIndex(new_tip);
    if (!Commit()) {
        // If commit fails, revert the best block index to avoid corruption.
        SetBestBlockIndex(current_tip);
        return false;
    }

    return true;
}